

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void shutdown_behavior_impl(_func_void_int_ptr *fd_fun)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ssize_t sVar6;
  char *pcVar7;
  socklen_t local_258;
  uint local_254;
  socklen_t errlen_1;
  int error_1;
  socklen_t errlen;
  int error;
  uint8_t data [512];
  undefined1 uStack_3d;
  int n;
  epoll_event event_result;
  epoll_event event;
  char c;
  int counter;
  int fds [3];
  int ep;
  _func_void_int_ptr *fd_fun_local;
  
  iVar3 = epoll_create1(0x80000);
  if (iVar3 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x601,"ep >= 0");
  }
  connector_epfd = iVar3;
  (*fd_fun)((int *)((long)&event.data + 5));
  connector_epfd = -1;
  event.data.u64._1_4_ = 0;
  event.data.fd._0_1_ = 0x2a;
  write(stack0xffffffffffffffe0,&event.data,1);
  event_result.data.fd = 5;
  event_result.data.u64._4_4_ = counter;
  epoll_ctl(iVar3,1,counter,(epoll_event *)&event_result.data);
  piVar5 = __errno_location();
  *piVar5 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        data._508_4_ = epoll_wait(iVar3,(epoll_event *)&uStack_3d,1,-1);
        if (data._508_4_ != 1) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x618,"(n = epoll_wait(ep, &event_result, 1, -1)) == 1");
        }
        if (stack0xffffffffffffffc7 != counter) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x61a,"event_result.data.fd == fds[1]");
        }
        if ((_uStack_3d & 1) == 0) break;
        sVar6 = read(counter,&event.data,1);
        data._508_4_ = (undefined4)sVar6;
        if (data._508_4_ != 1) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x621,"(n = (int)read(fds[1], &c, 1)) == 1");
        }
        event.data.u64._1_4_ = event.data.u64._1_4_ + 1;
        if ((int)event.data.u64._1_4_ < 6) {
          send(stack0xffffffffffffffe0,&event.data,1,0x4000);
        }
        else if (event.data.u64._1_4_ == 6) {
          send(stack0xffffffffffffffe0,&event.data,1,0x4000);
          shutdown(stack0xffffffffffffffe0,1);
          usleep(100000);
        }
        else {
          memset(&errlen,0,0x200);
          send(counter,&errlen,0x200,0x4000);
          close(stack0xffffffffffffffe0);
          event_result.data.fd = 4;
          event_result.data.u64._4_4_ = counter;
          iVar4 = epoll_ctl(iVar3,3,counter,(epoll_event *)&event_result.data);
          if (iVar4 != 0) {
            microatf_fail_require
                      ("%s:%d: %s not met",
                       "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                       ,0x635,"epoll_ctl(ep, EPOLL_CTL_MOD, fds[1], &event) == 0");
          }
          usleep(100000);
        }
      }
      if (_uStack_3d != 4) break;
      send(event_result.data.u64._4_4_,&event.data,1,0x4000);
    }
    if ((fd_fun == fd_domain_socket) && ((_uStack_3d & 0x14) == 0x14)) {
      error_1 = 0;
      errlen_1 = 4;
      getsockopt(counter,1,4,&error_1,&errlen_1);
      iVar4 = error_1;
      pFVar1 = _stderr;
      pcVar7 = strerror(error_1);
      fprintf(pFVar1,"socket error: %d (%s)\n",(ulong)(uint)iVar4,pcVar7);
      goto LAB_0010a5de;
    }
    if ((fd_fun == fd_tcp_socket) && (_uStack_3d == 0x1c)) {
      local_254 = 0;
      local_258 = 4;
      getsockopt(counter,1,4,&local_254,&local_258);
      uVar2 = local_254;
      pFVar1 = _stderr;
      pcVar7 = strerror(local_254);
      fprintf(pFVar1,"socket error: %d (%s)\n",(ulong)uVar2,pcVar7);
      goto LAB_0010a5de;
    }
    if ((fd_fun == fd_tcp_socket) && (_uStack_3d == 0x14)) break;
    microatf_fail_require
              ("%s:%d: %p(%p/%p): events %x",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x660,fd_fun,fd_domain_socket,fd_tcp_socket,_uStack_3d);
  }
  fprintf(_stderr,"no socket error\n");
LAB_0010a5de:
  iVar4 = close(counter);
  if (iVar4 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x664,"close(fds[1]) == 0");
  }
  if ((fds[0] != -1) && (iVar4 = close(fds[0]), iVar4 != 0)) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x665,"fds[2] == -1 || close(fds[2]) == 0");
  }
  iVar3 = close(iVar3);
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x666,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
shutdown_behavior_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	connector_epfd = ep;

	int fds[3];
	fd_fun(fds);

	connector_epfd = -1;

	int counter = 0;
	char c = 42;
	write(fds[0], &c, 1);

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN;
	event.data.fd = fds[1];
	epoll_ctl(ep, EPOLL_CTL_ADD, fds[1], &event);

	errno = 0;

	for (;;) {
		struct epoll_event event_result;
		int n;
		ATF_REQUIRE((n = epoll_wait(ep, &event_result, 1, -1)) == 1);

		ATF_REQUIRE(event_result.data.fd == fds[1]);

		// fprintf(stderr, "got event: %x %d\n",
		// (int)event_result.events,
		//     (int)event_result.events);

		if (event_result.events & EPOLLIN) {
			ATF_REQUIRE((n = (int)read(fds[1], &c, 1)) == 1);

			++counter;

			if (counter <= 5) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
			} else if (counter == 6) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
				shutdown(fds[0], SHUT_WR);

				usleep(100000);
			} else {
				uint8_t data[512] = { 0 };
				send(fds[1], &data, sizeof(data), MSG_NOSIGNAL);

				close(fds[0]);

				event.events = EPOLLOUT;
				event.data.fd = fds[1];
				ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, /**/
						fds[1], &event) == 0);

				usleep(100000);
			}

		} else if (event_result.events == EPOLLOUT) {
			send(event.data.fd, &c, 1, MSG_NOSIGNAL);
			// continue
		} else if (fd_fun == fd_domain_socket &&
		    (event_result.events & (EPOLLOUT | EPOLLHUP)) ==
			(EPOLLOUT | EPOLLHUP)) {
			// TODO(jan): Linux sets EPOLLERR in addition
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLERR | EPOLLHUP)) {
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLHUP)) {
			/*
			 * Rarely, we get here (no EPOLLERR). But don't fail
			 * the test. There is some non-determinism involved...
			 */
			fprintf(stderr, "no socket error\n");
			break;
		} else {
			ATF_REQUIRE_MSG(false, "%p(%p/%p): events %x",
			    (void *)fd_fun, (void *)fd_domain_socket,
			    (void *)fd_tcp_socket, event_result.events);
		}
	}

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}